

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O3

void __thiscall OpenMD::NPA::evolveEtaB(NPA *this)

{
  Mat3x3d *pMVar1;
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  
  pMVar1 = &this->prevEta;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      (pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar3] =
           pMVar1[-2].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar3]
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pMVar1 = (Mat3x3d *)
             ((pMVar1->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar2 != 3);
  (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       (((this->super_NPT).targetPressure / -163882576.0 +
        (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        [2][2]) *
       (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
       (this->super_NPT).instaVol) / ((this->super_NPT).NkBT * (this->super_NPT).tb2) +
       (this->oldEta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  return;
}

Assistant:

void NPA::evolveEtaB() {
    prevEta = eta;
    eta(2, 2) =
        oldEta(2, 2) +
        dt2 * instaVol *
            (press(2, 2) - targetPressure / Constants::pressureConvert) /
            (NkBT * tb2);
  }